

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_credential.cc
# Opt level: O0

bool bssl::ssl_credential_matches_requested_issuers(SSL_HANDSHAKE *hs,SSL_CREDENTIAL *cred)

{
  bool bVar1;
  int iVar2;
  pointer sk;
  Type *buf;
  uint8_t *ptr;
  Array<unsigned_char> *container;
  size_t sVar3;
  StackIterator<stack_st_CRYPTO_BUFFER> other;
  Span<const_unsigned_char> local_c8;
  Span<const_unsigned_char> local_b8;
  undefined1 local_a8 [8];
  CBS candidate;
  undefined1 local_88 [8];
  CBS cbs;
  CRYPTO_BUFFER *ca_name;
  StackIterator<stack_st_CRYPTO_BUFFER> __end2;
  StackIterator<stack_st_CRYPTO_BUFFER> __begin2;
  pointer *__range2;
  SSL_CREDENTIAL *cred_local;
  SSL_HANDSHAKE *hs_local;
  
  if ((cred->must_match_issuer & 1U) == 0) {
    hs_local._7_1_ = true;
  }
  else {
    bVar1 = std::operator!=(&hs->ca_names,(nullptr_t)0x0);
    if (bVar1) {
      sk = std::unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::get(&hs->ca_names);
      join_0x00000010_0x00000000_ = begin<stack_st_CRYPTO_BUFFER>(sk);
      other = end<stack_st_CRYPTO_BUFFER>(sk);
      while (bVar1 = internal::StackIteratorImpl<stack_st_CRYPTO_BUFFER>::operator!=
                               ((StackIteratorImpl<stack_st_CRYPTO_BUFFER> *)&__end2.idx_,other),
            bVar1) {
        buf = internal::StackIteratorImpl<stack_st_CRYPTO_BUFFER>::operator*
                        ((StackIteratorImpl<stack_st_CRYPTO_BUFFER> *)&__end2.idx_);
        ptr = CRYPTO_BUFFER_data(buf);
        sVar3 = CRYPTO_BUFFER_len(buf);
        Span<const_unsigned_char>::Span((Span<const_unsigned_char> *)&cbs.len,ptr,sVar3);
        bVar1 = ssl_credential_st::ChainContainsIssuer(cred,stack0xffffffffffffff88);
        if (bVar1) {
          return true;
        }
        internal::StackIteratorImpl<stack_st_CRYPTO_BUFFER>::operator++
                  ((StackIteratorImpl<stack_st_CRYPTO_BUFFER> *)&__end2.idx_);
      }
    }
    bVar1 = Array<unsigned_char>::empty(&cred->trust_anchor_id);
    if ((bVar1) ||
       (bVar1 = std::optional::operator_cast_to_bool((optional *)&hs->peer_requested_trust_anchors),
       !bVar1)) {
LAB_003703e3:
      ERR_put_error(0x10,0,0x143,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_credential.cc"
                    ,100);
      hs_local._7_1_ = false;
    }
    else {
      container = std::optional<bssl::Array<unsigned_char>_>::operator*
                            (&hs->peer_requested_trust_anchors);
      Span<unsigned_char_const>::Span<bssl::Array<unsigned_char>,void,bssl::Array<unsigned_char>>
                ((Span<unsigned_char_const> *)&candidate.len,container);
      cbs_st::cbs_st((cbs_st *)local_88,stack0xffffffffffffff68);
      do {
        sVar3 = CBS_len((CBS *)local_88);
        if (sVar3 == 0) goto LAB_003703e3;
        iVar2 = CBS_get_u8_length_prefixed((CBS *)local_88,(CBS *)local_a8);
        if ((iVar2 == 0) || (sVar3 = CBS_len((CBS *)local_a8), sVar3 == 0)) {
          ERR_put_error(0x10,0,0x44,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_credential.cc"
                        ,0x5a);
          return false;
        }
        local_b8 = cbs_st::operator_cast_to_Span((cbs_st *)local_a8);
        Span<unsigned_char_const>::Span<bssl::Array<unsigned_char>,void,bssl::Array<unsigned_char>>
                  ((Span<unsigned_char_const> *)&local_c8,&cred->trust_anchor_id);
        bVar1 = internal::operator==(local_b8,local_c8);
      } while (!bVar1);
      *(uint *)&hs->field_0x6c8 = *(uint *)&hs->field_0x6c8 & 0xfbffffff | 0x4000000;
      hs_local._7_1_ = true;
    }
  }
  return hs_local._7_1_;
}

Assistant:

bool ssl_credential_matches_requested_issuers(SSL_HANDSHAKE *hs,
                                              const SSL_CREDENTIAL *cred) {
  if (!cred->must_match_issuer) {
    // This credential does not need to match a requested issuer, so
    // it is good to use without a match.
    return true;
  }

  // If we have names sent by the CA extension, and this
  // credential matches it, it is good.
  if (hs->ca_names != nullptr) {
    for (const CRYPTO_BUFFER *ca_name : hs->ca_names.get()) {
      if (cred->ChainContainsIssuer(
              Span(CRYPTO_BUFFER_data(ca_name), CRYPTO_BUFFER_len(ca_name)))) {
        return true;
      }
    }
  }
  // If the credential has a trust anchor ID and it matches one sent by the
  // peer, it is good.
  if (!cred->trust_anchor_id.empty() && hs->peer_requested_trust_anchors) {
    CBS cbs = CBS(*hs->peer_requested_trust_anchors), candidate;
    while (CBS_len(&cbs) > 0) {
      if (!CBS_get_u8_length_prefixed(&cbs, &candidate) ||
          CBS_len(&candidate) == 0) {
        OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
        return false;
      }
      if (candidate == Span(cred->trust_anchor_id)) {
        hs->matched_peer_trust_anchor = true;
        return true;
      }
    }
  }

  OPENSSL_PUT_ERROR(SSL, SSL_R_NO_MATCHING_ISSUER);
  return false;
}